

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::write_buffer
          (xml_buffered_writer *this,char_t *data,size_t length)

{
  size_t sVar1;
  size_t offset;
  size_t length_local;
  char_t *data_local;
  xml_buffered_writer *this_local;
  
  sVar1 = this->bufsize;
  if (sVar1 + length < 0x801) {
    memcpy(this->buffer + sVar1,data,length);
    this->bufsize = sVar1 + length;
  }
  else {
    write_direct(this,data,length);
  }
  return;
}

Assistant:

void write_buffer(const char_t* data, size_t length)
		{
			size_t offset = bufsize;

			if (offset + length <= bufcapacity)
			{
				memcpy(buffer + offset, data, length * sizeof(char_t));
				bufsize = offset + length;
			}
			else
			{
				write_direct(data, length);
			}
		}